

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcList * sqlite3SrcListEnlarge(Parse *pParse,SrcList *pSrc,int nExtra,int iStart)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  Select **ppSVar5;
  long lVar6;
  ulong uVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  long lVar10;
  byte bVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  bVar11 = 0;
  iVar13 = pSrc->nSrc;
  if (pSrc->nAlloc < (uint)(iVar13 + nExtra)) {
    if (199 < iVar13 + nExtra) {
      sqlite3ErrorMsg(pParse,"too many FROM clause terms, max: %d",200);
      return (SrcList *)0x0;
    }
    lVar6 = (long)nExtra + (long)iVar13 * 2;
    lVar10 = 200;
    if (lVar6 < 200) {
      lVar10 = lVar6;
    }
    pSrc = (SrcList *)sqlite3DbRealloc(pParse->db,pSrc,lVar10 * 0x68 + 8);
    if (pSrc == (SrcList *)0x0) {
      return (SrcList *)0x0;
    }
    pSrc->nAlloc = (u32)lVar10;
    iVar13 = pSrc->nSrc;
  }
  if (iStart < iVar13) {
    lVar6 = (long)iVar13;
    lVar10 = lVar6 * 0x68 + -0x60;
    do {
      lVar6 = lVar6 + -1;
      puVar8 = (undefined8 *)((long)pSrc->a + lVar10 + -8);
      puVar9 = (undefined8 *)((long)pSrc->a + lVar10 + (long)nExtra * 0x68 + -8);
      for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar9 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
        puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
      }
      lVar10 = lVar10 + -0x68;
    } while (iStart < lVar6);
    iVar13 = pSrc->nSrc;
  }
  lVar6 = (long)iStart;
  pSrc->nSrc = iVar13 + nExtra;
  memset(pSrc->a + lVar6,0,(long)nExtra * 0x68);
  auVar3 = _DAT_001c0520;
  auVar2 = _DAT_001c0510;
  auVar1 = _DAT_001c0500;
  if (0 < nExtra) {
    lVar10 = (long)(iStart + nExtra);
    if ((long)(iStart + nExtra) < lVar6 + 1) {
      lVar10 = lVar6 + 1;
    }
    lVar4 = (lVar10 - lVar6) + -1;
    auVar12._8_4_ = (int)lVar4;
    auVar12._0_8_ = lVar4;
    auVar12._12_4_ = (int)((ulong)lVar4 >> 0x20);
    ppSVar5 = &pSrc[3].a[lVar6].pSelect;
    uVar7 = 0;
    auVar12 = auVar12 ^ _DAT_001c0520;
    do {
      auVar14._8_4_ = (int)uVar7;
      auVar14._0_8_ = uVar7;
      auVar14._12_4_ = (int)(uVar7 >> 0x20);
      auVar15 = (auVar14 | auVar2) ^ auVar3;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        *(undefined4 *)(ppSVar5 + -0x27) = 0xffffffff;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        *(undefined4 *)(ppSVar5 + -0x1a) = 0xffffffff;
      }
      auVar14 = (auVar14 | auVar1) ^ auVar3;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
        *(undefined4 *)(ppSVar5 + -0xd) = 0xffffffff;
        *(undefined4 *)ppSVar5 = 0xffffffff;
      }
      uVar7 = uVar7 + 4;
      ppSVar5 = ppSVar5 + 0x34;
    } while (((lVar10 - lVar6) + 3U & 0xfffffffffffffffc) != uVar7);
  }
  return pSrc;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  Parse *pParse,     /* Parsing context into which errors are reported */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( (u32)pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    sqlite3_int64 nAlloc = 2*(sqlite3_int64)pSrc->nSrc+nExtra;
    sqlite3 *db = pParse->db;

    if( pSrc->nSrc+nExtra>=SQLITE_MAX_SRCLIST ){
      sqlite3ErrorMsg(pParse, "too many FROM clause terms, max: %d",
                      SQLITE_MAX_SRCLIST);
      return 0;
    }
    if( nAlloc>SQLITE_MAX_SRCLIST ) nAlloc = SQLITE_MAX_SRCLIST;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return 0;
    }
    pSrc = pNew;
    pSrc->nAlloc = nAlloc;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}